

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::_::EagerPromiseNode<int>_> __thiscall
kj::heap<kj::_::EagerPromiseNode<int>,kj::Own<kj::_::PromiseNode>>
          (kj *this,Own<kj::_::PromiseNode> *params)

{
  EagerPromiseNode<int> *this_00;
  Own<kj::_::PromiseNode> *dependency;
  EagerPromiseNode<int> *extraout_RDX;
  Own<kj::_::EagerPromiseNode<int>_> OVar1;
  Own<kj::_::PromiseNode> *params_local;
  
  this_00 = (EagerPromiseNode<int> *)operator_new(0x1b8);
  dependency = fwd<kj::Own<kj::_::PromiseNode>>(params);
  _::EagerPromiseNode<int>::EagerPromiseNode(this_00,dependency);
  Own<kj::_::EagerPromiseNode<int>_>::Own
            ((Own<kj::_::EagerPromiseNode<int>_> *)this,this_00,
             (Disposer *)&_::HeapDisposer<kj::_::EagerPromiseNode<int>>::instance);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}